

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O3

double __thiscall
HEkk::computeDualForTableauColumn(HEkk *this,HighsInt iVar,HVector *tableau_column)

{
  int iVar1;
  pointer pdVar2;
  long lVar3;
  double dVar4;
  
  pdVar2 = (this->info_).workCost_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar4 = pdVar2[iVar];
  if (0 < (long)tableau_column->count) {
    lVar3 = 0;
    do {
      iVar1 = (tableau_column->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar3];
      dVar4 = dVar4 - (tableau_column->array).super__Vector_base<double,_std::allocator<double>_>.
                      _M_impl.super__Vector_impl_data._M_start[iVar1] *
                      pdVar2[(this->basis_).basicIndex_.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar1]];
      lVar3 = lVar3 + 1;
    } while (tableau_column->count != lVar3);
  }
  return dVar4;
}

Assistant:

double HEkk::computeDualForTableauColumn(const HighsInt iVar,
                                         const HVector& tableau_column) {
  const vector<double>& workCost = info_.workCost_;
  const vector<HighsInt>& basicIndex = basis_.basicIndex_;

  double dual = info_.workCost_[iVar];
  for (HighsInt i = 0; i < tableau_column.count; i++) {
    HighsInt iRow = tableau_column.index[i];
    dual -= tableau_column.array[iRow] * workCost[basicIndex[iRow]];
  }
  return dual;
}